

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O0

void __thiscall MeshSplitter::Execute(MeshSplitter *this,aiScene *pScene)

{
  uint uVar1;
  size_type sVar2;
  void *__s;
  reference pvVar3;
  ulong __n;
  uint local_4c;
  uint i;
  uint size;
  uint local_34;
  undefined1 local_30 [4];
  uint a;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  source_mesh_map;
  aiScene *pScene_local;
  MeshSplitter *this_local;
  
  source_mesh_map.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pScene;
  std::
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
  vector((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *)local_30);
  for (local_34 = 0;
      local_34 <
      *(uint *)&source_mesh_map.
                super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first; local_34 = local_34 + 1
      ) {
    SplitMesh(this,local_34,
              *(aiMesh **)
               (*(long *)&source_mesh_map.
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second +
               (ulong)local_34 * 8),
              (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *)local_30);
  }
  sVar2 = std::
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  *)local_30);
  uVar1 = (uint)sVar2;
  if (uVar1 != *(uint *)&source_mesh_map.
                         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first) {
    if (*(void **)&source_mesh_map.
                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second != (void *)0x0) {
      operator_delete__(*(void **)&source_mesh_map.
                                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second);
    }
    *(uint *)&source_mesh_map.
              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first = uVar1;
    __n = (sVar2 & 0xffffffff) << 3;
    __s = operator_new__(__n);
    memset(__s,0,__n);
    *(void **)&source_mesh_map.
               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second = __s;
    for (local_4c = 0; local_4c < uVar1; local_4c = local_4c + 1) {
      pvVar3 = std::
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                             *)local_30,(ulong)local_4c);
      *(aiMesh **)
       (*(long *)&source_mesh_map.
                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second + (ulong)local_4c * 8
       ) = pvVar3->first;
    }
    UpdateNode(this,*(aiNode **)
                     &(source_mesh_map.
                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->second,
               (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                *)local_30);
  }
  std::
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
  ~vector((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
           *)local_30);
  return;
}

Assistant:

void MeshSplitter::Execute( aiScene* pScene) {
	std::vector<std::pair<aiMesh*, unsigned int> > source_mesh_map;

	for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
		SplitMesh(a, pScene->mMeshes[a],source_mesh_map);
	}

	const unsigned int size = static_cast<unsigned int>(source_mesh_map.size());
	if (size != pScene->mNumMeshes) {
		// it seems something has been split. rebuild the mesh list
		delete[] pScene->mMeshes;
		pScene->mNumMeshes = size;
		pScene->mMeshes = new aiMesh*[size]();

		for (unsigned int i = 0; i < size;++i) {
			pScene->mMeshes[i] = source_mesh_map[i].first;
		}

		// now we need to update all nodes
		UpdateNode(pScene->mRootNode,source_mesh_map);
	}
}